

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O2

void scan_flux_vista(TrackData *trackdata)

{
  FluxData *flux_revs;
  BitBuffer bitbuf;
  FluxDecoder decoder;
  
  flux_revs = TrackData::flux(trackdata);
  FluxDecoder::FluxDecoder(&decoder,flux_revs,2000,100,4);
  BitBuffer::BitBuffer(&bitbuf,_250K,&decoder);
  TrackData::add(trackdata,&bitbuf);
  scan_bitstream_vista(trackdata);
  BitBuffer::~BitBuffer(&bitbuf);
  return;
}

Assistant:

void scan_flux_vista(TrackData& trackdata)
{
    // Fixed data rate.
    auto datarate = DataRate::_250K;
    FluxDecoder decoder(trackdata.flux(), bitcell_ns(datarate));
    BitBuffer bitbuf(datarate, decoder);

    trackdata.add(std::move(bitbuf));
    scan_bitstream_vista(trackdata);
}